

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_StringPositional_Test::~ClCommandLine_StringPositional_Test
          (ClCommandLine_StringPositional_Test *this)

{
  ClCommandLine_StringPositional_Test *this_local;
  
  ~ClCommandLine_StringPositional_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, StringPositional) {
    opt<std::string> option ("arg", positional);
    EXPECT_EQ (option.get (), "") << "Expected inital string value to be empty";

    this->add ("progname", "hello");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "hello");
}